

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O1

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  byte bVar1;
  int iVar2;
  upb_MiniTableEnum *puVar3;
  uint uVar4;
  uint uVar5;
  ulong in_RCX;
  ulong uVar6;
  byte *pbVar7;
  uint val;
  byte *pbVar8;
  uint uVar9;
  byte *in_R11;
  bool bVar10;
  
  iVar2 = __sigsetjmp((decoder->base).err,0);
  if (iVar2 == 0) {
    if (len != 0) {
      if (*data != '!') {
        upb_MdDecoder_ErrorJmp(&decoder->base,"Invalid enum version: %c");
      }
      data = data + 1;
    }
    if (decoder->enum_table == (upb_MiniTableEnum *)0x0) {
      upb_MdDecoder_ErrorJmp(&decoder->base,"Out of memory");
    }
    decoder->enum_table->mask_limit_dont_copy_me__upb_internal_use_only = 0x40;
    val = 0;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3->value_count_dont_copy_me__upb_internal_use_only = 0;
    pbVar7 = (byte *)(decoder->base).end;
    if (data < pbVar7) {
      do {
        bVar1 = *data;
        data = (char *)((byte *)data + 1);
        uVar6 = (long)(char)bVar1 & 0xffffffff;
        if ((long)(char)bVar1 < 0x42) {
          uVar4 = 0xffffffff;
          if (0xa0 < (byte)(bVar1 + 0x81)) {
            uVar4 = (uint)""[(int)(char)bVar1 - 0x20];
          }
          uVar6 = (ulong)uVar4;
          iVar2 = 0;
          do {
            if ((uVar6 & 1) != 0) {
              puVar3 = decoder->enum_table;
              uVar4 = decoder->enum_value_count + 1;
              decoder->enum_value_count = uVar4;
              if (puVar3->value_count_dont_copy_me__upb_internal_use_only == 0) {
                if (val >> 5 <= uVar4 || val < 0x201) {
                  uVar4 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only;
                  while (uVar4 < (val & 0xffffffe0) + 0x20) {
                    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
                    uVar4 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only + 0x20;
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only = uVar4;
                  }
                  (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] =
                       (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] |
                       1 << ((byte)val & 0x1f);
                  goto LAB_003076cf;
                }
                if (decoder->enum_data_count !=
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only >> 5) {
                  __assert_fail("d->enum_data_count == table->mask_limit_dont_copy_me__upb_internal_use_only / 32"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/build_enum.c"
                                ,0x40,
                                "void upb_MiniTableEnum_BuildValue(upb_MdEnumDecoder *, uint32_t)");
                }
              }
              puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,val);
              puVar3->value_count_dont_copy_me__upb_internal_use_only =
                   puVar3->value_count_dont_copy_me__upb_internal_use_only + 1;
            }
LAB_003076cf:
            iVar2 = iVar2 + 1;
            val = val + 1;
            uVar6 = uVar6 >> 1;
          } while (iVar2 != 5);
          in_RCX = in_RCX & 0xffffffff;
        }
        else {
          if (0x1f < (byte)(bVar1 + 0xa1)) {
            upb_MdDecoder_ErrorJmp
                      (&decoder->base,"Unexpected character: %c",(ulong)(uint)(int)(char)bVar1);
          }
          for (uVar4 = 0x1f; 0x1eU >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
          uVar9 = 0;
          pbVar8 = (byte *)data;
          in_RCX = in_RCX & 0xffffffff;
          uVar5 = uVar9;
          do {
            data = (char *)pbVar8;
            iVar2 = -1;
            if (0xa0 < (byte)((char)uVar6 + 0x81U)) {
              iVar2 = (int)""[((uint)uVar6 & 0xff) - 0x20];
            }
            uVar5 = uVar5 | iVar2 + -0x3c << ((byte)uVar9 & 0x1f);
            if (((byte *)data == pbVar7) || (bVar1 = *data, (byte)(bVar1 + 0x81) < 0xe0)) {
              bVar10 = false;
              in_RCX = (ulong)uVar5;
              pbVar8 = (byte *)data;
            }
            else {
              pbVar8 = (byte *)data + 1;
              uVar9 = uVar9 + (uVar4 ^ 0xffffffe0) + 0x21;
              bVar10 = uVar9 < 0x20;
              data = (char *)in_R11;
              if (!bVar10) {
                data = (char *)0x0;
              }
              uVar6 = (ulong)bVar1;
            }
            in_R11 = (byte *)data;
          } while (bVar10);
          if ((byte *)data == (byte *)0x0) {
            upb_MdDecoder_ErrorJmp(&decoder->base,"Overlong varint");
          }
          val = val + (int)in_RCX;
        }
        pbVar7 = (byte *)(decoder->base).end;
      } while (data < pbVar7);
    }
    puVar3 = decoder->enum_table;
  }
  else {
    puVar3 = (upb_MiniTableEnum *)0x0;
  }
  return puVar3;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}